

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

uchar * mcmload(mcmcxdef *cctx,mcmon cnum)

{
  ushort uVar1;
  uint uVar2;
  mcmcx1def *ctx;
  mcmodef *pmVar3;
  mcmodef *pmVar4;
  ulong uVar5;
  mcmcxdef *pmVar6;
  ulong uVar7;
  undefined6 in_register_00000032;
  long *plVar8;
  mcmon newn;
  errdef fr_;
  ushort local_17a;
  uint local_178;
  uint local_174;
  mcmcxdef *local_170;
  errdef local_168;
  
  ctx = cctx->mcmcxgl;
  local_174 = (uint)CONCAT62(in_register_00000032,cnum);
  uVar1 = cctx->mcmcxmtb[CONCAT62(in_register_00000032,cnum) >> 8 & 0xffffff][local_174 & 0xff];
  local_178 = (uint)uVar1;
  pmVar3 = ctx->mcmcxtab[uVar1 >> 8];
  uVar5 = (ulong)((uVar1 & 0xff) << 5);
  local_170 = cctx;
  mcmalo0(cctx,*(ushort *)((long)&pmVar3->mcmosiz + uVar5),&local_17a,0xffff,1);
  pmVar4 = ctx->mcmcxtab[local_17a >> 8];
  uVar7 = (ulong)((local_17a & 0xff) << 5);
  *(undefined8 *)((long)&pmVar3->mcmoptr + uVar5) = *(undefined8 *)((long)&pmVar4->mcmoptr + uVar7);
  *(undefined2 *)((long)&pmVar3->mcmosiz + uVar5) = *(undefined2 *)((long)&pmVar4->mcmosiz + uVar7);
  local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
  pmVar6 = local_170;
  if (local_168.errcode != 0) {
    ctx->mcmcxerr->errcxptr = local_168.errprv;
    mcmgunlck(ctx,local_17a);
    mcmgfre(ctx,local_17a);
    errrse1(ctx->mcmcxerr,&local_168);
  }
  plVar8 = (long *)((long)&pmVar3->mcmoptr + uVar5);
  local_168.errprv = ctx->mcmcxerr->errcxptr;
  ctx->mcmcxerr->errcxptr = &local_168;
  if ((*(byte *)((long)plVar8 + 0x14) & 3) == 0) {
    if (local_170->mcmcxldf == (_func_void_void_ptr_mclhd_uchar_ptr_ushort *)0x0) {
      errsigf(ctx->mcmcxerr,"TADS",0xf);
    }
    (*local_170->mcmcxldf)(local_170->mcmcxldc,plVar8[1],(uchar *)*plVar8,*(ushort *)(plVar8 + 3));
  }
  else {
    mcsin(&ctx->mcmcxswc,*(mcsseg *)(plVar8 + 1),(uchar *)*plVar8,*(ushort *)(plVar8 + 3));
    pmVar6 = local_170;
  }
  ctx->mcmcxerr->errcxptr = local_168.errprv;
  *(short *)(*plVar8 + -8) = (short)local_178;
  *(undefined2 *)((long)&pmVar4->mcmoflg + uVar7) = 0;
  *(mcmon *)((long)&pmVar4->mcmonxt + uVar7) = ctx->mcmcxunu;
  ctx->mcmcxunu = local_17a;
  uVar2 = *(uint *)((long)plVar8 + 0x14);
  *(ushort *)((long)plVar8 + 0x14) = (ushort)uVar2 & 0xfff0 | 0xe;
  *(undefined1 *)((long)plVar8 + 0x16) = 1;
  if ((uVar2 >> 8 & 1) != 0) {
    (*pmVar6->mcmcxrvf)(pmVar6->mcmcxrvc,(mcmon)local_174);
    *(byte *)((long)plVar8 + 0x15) = *(byte *)((long)plVar8 + 0x15) & 0xfe;
  }
  return (uchar *)*plVar8;
}

Assistant:

uchar *mcmload(mcmcxdef *cctx, mcmon cnum)
{
    mcmcx1def   *ctx = cctx->mcmcxgl;
    mcmodef     *o = mcmobje(cctx, cnum);
    mcmodef     *newdef;
    mcmon        newn;
    mcmon        num = mcmc2g(cctx, cnum);
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);

    /* we first need to obtain some memory for this object */
    (void)mcmalo0(cctx, o->mcmosiz, &newn, MCMONINV, TRUE);
    newdef = mcmgobje(ctx, newn);
    
    /* use memory block from our new object */
    o->mcmoptr = newdef->mcmoptr;
    o->mcmosiz = newdef->mcmosiz;

    /* load or swap the object in */
    ERRBEGIN(ctx->mcmcxerr)
        if (o->mcmoflg & (MCMOFNODISC | MCMOFDIRTY))
            mcsin(&ctx->mcmcxswc, o->mcmoswh, o->mcmoptr, o->mcmosiz);
        else if (cctx->mcmcxldf)
            (*cctx->mcmcxldf)(cctx->mcmcxldc, o->mcmoldh, o->mcmoptr,
                              o->mcmosiz);
        else
            errsig(ctx->mcmcxerr, ERR_NOLOAD);
    ERRCLEAN(ctx->mcmcxerr)
        mcmgunlck(ctx, newn);                          /* unlock the object */
        mcmgfre(ctx, newn);              /* don't need new memory after all */
    ERRENDCLN(ctx->mcmcxerr)

    /* unuse the new cache entry we obtained (we just wanted the memory) */
/* @@@ */
    *(mcmon *)(o->mcmoptr - osrndsz(sizeof(mcmon))) = num;      /* set obj# */
    newdef->mcmoflg = 0;                        /* mark new block as unused */
    newdef->mcmonxt = ctx->mcmcxunu;                /* link to unused chain */
    ctx->mcmcxunu = newn;

    /* set flags in the newly loaded object and return */
    o->mcmoflg |= MCMOFPRES | MCMOFLOCK; /* object is now present in memory */
    o->mcmoflg &= ~MCMOFDIRTY;         /* not written since last swapped in */
    o->mcmoflg |= MCMOFNODISC; /* don't discard once it's been to swap file */
    o->mcmolcnt = 1;                                   /* one locker so far */
    
    /* if the object is to be reverted upon loading, revert it now */
    if (o->mcmoflg & MCMOFREVRT)
    {
        (*cctx->mcmcxrvf)(cctx->mcmcxrvc, cnum);
        o->mcmoflg &= ~MCMOFREVRT;
    }

    return(o->mcmoptr);
}